

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateBuilder
          (ImmutableMessageGenerator *this,Printer *printer)

{
  string_view text;
  string_view text_00;
  string_view text_01;
  MessageBuilderGenerator builderGenerator;
  undefined1 local_70 [88];
  
  text._M_str = "@java.lang.Override\npublic Builder newBuilderForType() { return newBuilder(); }\n"
  ;
  text._M_len = 0x50;
  io::Printer::Print<>(printer,text);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_70,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true
            );
  text_00._M_str =
       "public static Builder newBuilder() {\n  return DEFAULT_INSTANCE.toBuilder();\n}\npublic static Builder newBuilder($classname$ prototype) {\n  return DEFAULT_INSTANCE.toBuilder().mergeFrom(prototype);\n}\n@java.lang.Override\npublic Builder toBuilder() {\n  return this == DEFAULT_INSTANCE\n      ? new Builder() : new Builder().mergeFrom(this);\n}\n\n"
  ;
  text_00._M_len = 0x153;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_00,(char (*) [10])0x13005f3,(string *)local_70);
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  text_01._M_str =
       "@java.lang.Override\nprotected Builder newBuilderForType(\n    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n  Builder builder = new Builder(parent);\n  return builder;\n}\n"
  ;
  text_01._M_len = 0xb7;
  io::Printer::Print<>(printer,text_01);
  MessageBuilderGenerator::MessageBuilderGenerator
            ((MessageBuilderGenerator *)local_70,(this->super_MessageGenerator).descriptor_,
             this->context_);
  MessageBuilderGenerator::Generate((MessageBuilderGenerator *)local_70,printer);
  MessageBuilderGenerator::~MessageBuilderGenerator((MessageBuilderGenerator *)local_70);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateBuilder(io::Printer* printer) {
  // LITE_RUNTIME implements this at the GeneratedMessageLite level.
  printer->Print(
      "@java.lang.Override\n"
      "public Builder newBuilderForType() { return newBuilder(); }\n");

  printer->Print(
      "public static Builder newBuilder() {\n"
      "  return DEFAULT_INSTANCE.toBuilder();\n"
      "}\n"
      "public static Builder newBuilder($classname$ prototype) {\n"
      "  return DEFAULT_INSTANCE.toBuilder().mergeFrom(prototype);\n"
      "}\n"
      "@java.lang.Override\n"
      "public Builder toBuilder() {\n"
      "  return this == DEFAULT_INSTANCE\n"
      "      ? new Builder() : new Builder().mergeFrom(this);\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "@java.lang.Override\n"
      "protected Builder newBuilderForType(\n"
      "    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n"
      "  Builder builder = new Builder(parent);\n"
      "  return builder;\n"
      "}\n");

  MessageBuilderGenerator builderGenerator(descriptor_, context_);
  builderGenerator.Generate(printer);
}